

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

EntryType * __thiscall
JsUtil::
BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleHashedEntry,_JsUtil::AsymetricResizeLock>
::AllocateEntries(BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleHashedEntry,_JsUtil::AsymetricResizeLock>
                  *this,int size,bool zeroAllocate)

{
  bool bVar1;
  BOOL BVar2;
  HeapAllocator *pHVar3;
  undefined4 *puVar4;
  code *pcVar5;
  EntryType *pEVar6;
  long lVar7;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  local_50 = (undefined1  [8])
             &SimpleHashedEntry<Js::PropertyRecord_const*,Js::PropertyRecord_const*>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_1369e8;
  data.filename._0_4_ = 0x453;
  data.plusSize = (long)size;
  pHVar3 = Memory::HeapAllocator::TrackAllocInfo(this->alloc,(TrackAllocData *)local_50);
  lVar7 = -1;
  if (-1 < size) {
    lVar7 = (long)size << 4;
  }
  BVar2 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar2 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar1 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar1) goto LAB_007be95d;
    *puVar4 = 0;
  }
  if (zeroAllocate) {
    pcVar5 = Memory::HeapAllocator::AllocZero;
  }
  else {
    pcVar5 = Memory::HeapAllocator::Alloc;
  }
  pEVar6 = (EntryType *)(*pcVar5)(pHVar3,lVar7);
  if (pEVar6 == (EntryType *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar1 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar1) {
LAB_007be95d:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar4 = 0;
  }
  return pEVar6;
}

Assistant:

EntryType * AllocateEntries(DECLSPEC_GUARD_OVERFLOW int size, const bool zeroAllocate = true)
        {
            // Note that the choice of leaf/non-leaf node is decided for the EntryType on the basis of TValue. By default, if
            // TValue is a pointer, a non-leaf allocation is done. This behavior can be overridden by specializing
            // TypeAllocatorFunc for TValue.
            return
                AllocateArray<AllocatorType, EntryType, false>(
                    TRACK_ALLOC_INFO(alloc, EntryType, AllocatorType, 0, size),
                    zeroAllocate ? EntryAllocatorFuncType::GetAllocZeroFunc() : EntryAllocatorFuncType::GetAllocFunc(),
                    size);
        }